

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

string * cmCTest::CleanString(string *__return_storage_ptr__,string *str,size_type spos)

{
  long lVar1;
  size_type epos;
  size_type spos_local;
  string *str_local;
  
  lVar1 = std::__cxx11::string::find_first_not_of((char *)str,0xd1083e);
  std::__cxx11::string::find_last_not_of((char *)str,0xd1083e);
  if (lVar1 == -1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::CleanString(const std::string& str,
                                 std::string::size_type spos)
{
  spos = str.find_first_not_of(" \n\t\r\f\v", spos);
  std::string::size_type epos = str.find_last_not_of(" \n\t\r\f\v");
  if (spos == std::string::npos) {
    return std::string();
  }
  if (epos != std::string::npos) {
    epos = epos - spos + 1;
  }
  return str.substr(spos, epos);
}